

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,ByteData *key_bytes)

{
  ByteData local_40;
  ByteData local_28;
  
  ByteData::ByteData(&local_28,type);
  ByteData::Serialize(&local_40,key_bytes);
  ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr__,&local_28,&local_40);
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const ByteData &key_bytes) {
  return ByteData(type).Concat(key_bytes.Serialize());
}